

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

int __thiscall
rengine::Signal<int>::connect(Signal<int> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
  *this_00;
  iterator __position;
  iterator __position_00;
  long *plVar1;
  BucketBase *pBVar2;
  undefined8 *puVar3;
  sockaddr *extraout_RAX;
  undefined4 in_register_00000034;
  long lVar4;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *__range2;
  BucketBase *local_38;
  sockaddr *local_30;
  SignalHandler<int> *handler_local;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  puVar3 = *(undefined8 **)(lVar4 + 8);
  if (puVar3 != (undefined8 *)0x0) {
    for (plVar1 = (long *)*puVar3; plVar1 != (long *)puVar3[1]; plVar1 = plVar1 + 1) {
      pBVar2 = (BucketBase *)*plVar1;
      if (pBVar2->signal == &this->super_SignalBase) goto LAB_0010f1c8;
    }
  }
  pBVar2 = (BucketBase *)0x0;
LAB_0010f1c8:
  local_30 = __addr;
  if (pBVar2 == (BucketBase *)0x0) {
    pBVar2 = (BucketBase *)operator_new(0x28);
    pBVar2->_vptr_BucketBase = (_func_int **)0x0;
    pBVar2->signal = (SignalBase *)0x0;
    pBVar2->_vptr_BucketBase = (_func_int **)&PTR__Bucket_00115cf0;
    pBVar2[1]._vptr_BucketBase = (_func_int **)0x0;
    pBVar2[1].signal = (SignalBase *)0x0;
    pBVar2[2]._vptr_BucketBase = (_func_int **)0x0;
    pBVar2->signal = &this->super_SignalBase;
    if (puVar3 == (undefined8 *)0x0) {
      puVar3 = (undefined8 *)operator_new(0x18);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3[2] = 0;
      *(undefined8 **)(lVar4 + 8) = puVar3;
    }
    this_00 = *(vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
                **)(lVar4 + 8);
    __position._M_current = *(BucketBase ***)(this_00 + 8);
    local_38 = pBVar2;
    if (__position._M_current == *(BucketBase ***)(this_00 + 0x10)) {
      std::
      vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
      ::_M_realloc_insert<rengine::SignalEmitter::BucketBase*>(this_00,__position,&local_38);
    }
    else {
      *__position._M_current = pBVar2;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
  }
  __position_00._M_current = (SignalHandler<int> **)pBVar2[1].signal;
  if (__position_00._M_current == (SignalHandler<int> **)pBVar2[2]._vptr_BucketBase) {
    std::vector<rengine::SignalHandler<int>*,std::allocator<rengine::SignalHandler<int>*>>::
    _M_realloc_insert<rengine::SignalHandler<int>*const&>
              ((vector<rengine::SignalHandler<int>*,std::allocator<rengine::SignalHandler<int>*>> *)
               (pBVar2 + 1),__position_00,(SignalHandler<int> **)&local_30);
    local_30 = extraout_RAX;
  }
  else {
    *__position_00._M_current = (SignalHandler<int> *)local_30;
    pBVar2[1].signal = pBVar2[1].signal + 1;
  }
  return (int)local_30;
}

Assistant:

void connect(SignalEmitter *emitter, SignalHandler<Arguments ...> *handler)
    {
        Bucket *bucket = findBucket(emitter);
        if (!bucket) {
            bucket = new Bucket();
            bucket->signal = this;
            if (!emitter->m_buckets) {
                emitter->m_buckets = new std::vector<SignalEmitter::BucketBase *>();
            }
            emitter->m_buckets->push_back(bucket);
        }
        bucket->handlers.push_back(handler);
    }